

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Segment::Init(Segment *this,IMkvWriter *ptr_writer)

{
  bool bVar1;
  
  if (ptr_writer != (IMkvWriter *)0x0) {
    this->writer_cluster_ = ptr_writer;
    this->writer_cues_ = ptr_writer;
    this->writer_header_ = ptr_writer;
    memset(this->last_track_timestamp_,0,0x7e0);
    bVar1 = SegmentInfo::Init(&this->segment_info_);
    return bVar1;
  }
  return false;
}

Assistant:

bool Segment::Init(IMkvWriter* ptr_writer) {
  if (!ptr_writer) {
    return false;
  }
  writer_cluster_ = ptr_writer;
  writer_cues_ = ptr_writer;
  writer_header_ = ptr_writer;
  memset(&track_frames_written_, 0,
         sizeof(track_frames_written_[0]) * kMaxTrackNumber);
  memset(&last_track_timestamp_, 0,
         sizeof(last_track_timestamp_[0]) * kMaxTrackNumber);
  return segment_info_.Init();
}